

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SinglePoolStrategy.cpp
# Opt level: O0

void __thiscall
xmrig::SinglePoolStrategy::SinglePoolStrategy
          (SinglePoolStrategy *this,Pool *pool,int retryPause,int retries,
          IStrategyListener *listener,bool quiet)

{
  IClient *pIVar1;
  undefined4 in_ECX;
  int in_EDX;
  IStrategy *in_RDI;
  _func_int **in_R8;
  byte in_R9B;
  IClientListener *unaff_retaddr;
  int in_stack_0000000c;
  Pool *in_stack_00000010;
  
  IStrategy::IStrategy(in_RDI);
  IClientListener::IClientListener((IClientListener *)(in_RDI + 1));
  in_RDI->_vptr_IStrategy = (_func_int **)&PTR__SinglePoolStrategy_002b7528;
  in_RDI[1]._vptr_IStrategy = (_func_int **)&DAT_002b75a8;
  *(undefined1 *)&in_RDI[2]._vptr_IStrategy = 0;
  in_RDI[4]._vptr_IStrategy = in_R8;
  pIVar1 = Pool::createClient(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  in_RDI[3]._vptr_IStrategy = (_func_int **)pIVar1;
  (**(code **)(*in_RDI[3]._vptr_IStrategy + 0xb8))(in_RDI[3]._vptr_IStrategy,in_ECX);
  (**(code **)(*in_RDI[3]._vptr_IStrategy + 0xc0))(in_RDI[3]._vptr_IStrategy,(long)(in_EDX * 1000));
  (**(code **)(*in_RDI[3]._vptr_IStrategy + 0xb0))(in_RDI[3]._vptr_IStrategy,in_R9B & 1);
  return;
}

Assistant:

xmrig::SinglePoolStrategy::SinglePoolStrategy(const Pool &pool, int retryPause, int retries, IStrategyListener *listener, bool quiet) :
    m_active(false),
    m_listener(listener)
{
    m_client = pool.createClient(0, this);
    m_client->setRetries(retries);
    m_client->setRetryPause(retryPause * 1000);
    m_client->setQuiet(quiet);
}